

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereUsablePartialIndex(int iTab,u8 jointype,WhereClause *pWC,Expr *pWhere)

{
  Parse *pParse;
  Expr *pE1;
  int iVar1;
  int iVar2;
  WhereTerm *pWVar3;
  
  if ((jointype & 0x40) == 0) {
    pParse = pWC->pWInfo->pParse;
    for (; pWhere->op == ','; pWhere = pWhere->pRight) {
      iVar1 = whereUsablePartialIndex(iTab,jointype,pWC,pWhere->pLeft);
      if (iVar1 == 0) {
        return 0;
      }
    }
    pWVar3 = pWC->a;
    for (iVar1 = 0; iVar1 < pWC->nTerm; iVar1 = iVar1 + 1) {
      pE1 = pWVar3->pExpr;
      if ((pE1->flags & 1) == 0) {
        if ((jointype & 0x20) == 0) {
LAB_0018c9ee:
          iVar2 = sqlite3ExprImpliesExpr(pParse,pE1,pWhere,iTab);
          if ((iVar2 != 0) && ((pWVar3->wtFlags & 0x80) == 0)) {
            return 1;
          }
        }
      }
      else if ((pE1->w).iJoin == iTab) goto LAB_0018c9ee;
      pWVar3 = pWVar3 + 1;
    }
  }
  return 0;
}

Assistant:

static int whereUsablePartialIndex(
  int iTab,             /* The table for which we want an index */
  u8 jointype,          /* The JT_* flags on the join */
  WhereClause *pWC,     /* The WHERE clause of the query */
  Expr *pWhere          /* The WHERE clause from the partial index */
){
  int i;
  WhereTerm *pTerm;
  Parse *pParse;

  if( jointype & JT_LTORJ ) return 0;
  pParse = pWC->pWInfo->pParse;
  while( pWhere->op==TK_AND ){
    if( !whereUsablePartialIndex(iTab,jointype,pWC,pWhere->pLeft) ) return 0;
    pWhere = pWhere->pRight;
  }
  for(i=0, pTerm=pWC->a; i<pWC->nTerm; i++, pTerm++){
    Expr *pExpr;
    pExpr = pTerm->pExpr;
    if( (!ExprHasProperty(pExpr, EP_OuterON) || pExpr->w.iJoin==iTab)
     && ((jointype & JT_OUTER)==0 || ExprHasProperty(pExpr, EP_OuterON))
     && sqlite3ExprImpliesExpr(pParse, pExpr, pWhere, iTab)
     && (pTerm->wtFlags & TERM_VNULL)==0
    ){
      return 1;
    }
  }
  return 0;
}